

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<signed_char,_int>::Run
          (DataTransform<signed_char,_int> *this,istream *input_stream)

{
  int iVar1;
  uint uVar2;
  NumericType NVar3;
  WarningType WVar4;
  bool bVar5;
  char *__nptr;
  bool bVar6;
  uint uVar7;
  int *piVar8;
  undefined8 uVar9;
  ostream *poVar10;
  size_t sVar11;
  uint data_to_write;
  int iVar12;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar13;
  char input_data;
  string word;
  char buffer [128];
  char local_25f [3];
  ushort local_25c;
  short local_25a;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  iVar12 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        bVar5 = true;
        bVar6 = false;
      }
      else {
        piVar8 = __errno_location();
        iVar1 = *piVar8;
        *piVar8 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar9 = std::__throw_invalid_argument("stold");
LAB_001149d3:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar9);
        }
        if (*piVar8 == 0) {
          *piVar8 = iVar1;
        }
        else if (*piVar8 == 0x22) {
          uVar9 = std::__throw_out_of_range("stold");
          goto LAB_001149d3;
        }
        local_25c = in_FPUControlWord | 0xc00;
        local_25a = (short)ROUND(in_ST0);
        local_25f[0] = (char)local_25a;
        bVar5 = false;
        bVar6 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar6) goto LAB_00114732;
      if (bVar5) {
        if (!bVar5) {
          return false;
        }
        goto LAB_0011497f;
      }
    }
    else {
      bVar6 = sptk::ReadStream<signed_char>(local_25f,input_stream);
      if (!bVar6) {
LAB_0011497f:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar12 % this->num_column_ != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_00114732:
      uVar7 = (uint)local_25f[0];
      data_to_write = this->minimum_value_;
      uVar2 = this->maximum_value_;
      if ((int)data_to_write < (int)uVar2) {
        NVar3 = this->input_numeric_type_;
        if (NVar3 == kFloatingPoint) {
          if (((int)data_to_write <= (int)uVar7) &&
             (data_to_write = uVar2, (int)uVar7 <= (int)uVar2)) goto LAB_0011478b;
        }
        else if (NVar3 == kUnsignedInteger) {
          if (data_to_write <= uVar7) {
            bVar6 = uVar2 < uVar7;
            data_to_write = uVar2;
            if (!bVar6) {
              data_to_write = uVar7;
            }
            goto LAB_0011478f;
          }
        }
        else {
          if (NVar3 != kSignedInteger) goto LAB_0011478b;
          if ((int)data_to_write <= (int)uVar7) {
            bVar6 = (int)uVar2 < (int)uVar7;
            data_to_write = uVar2;
            if ((int)uVar7 <= (int)uVar2) {
              data_to_write = uVar7;
            }
            goto LAB_0011478f;
          }
        }
LAB_001147be:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar4 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          if (WVar4 == kExit) {
            return false;
          }
        }
      }
      else {
LAB_0011478b:
        bVar6 = false;
        data_to_write = uVar7;
LAB_0011478f:
        if ((bVar6) || (this->rounding_ == false)) {
          if (bVar6) goto LAB_001147be;
        }
        else {
          if (local_25f[0] < '\x01') {
            dVar13 = (double)(int)uVar7 + -0.5;
          }
          else {
            dVar13 = (double)(int)uVar7 + 0.5;
          }
          data_to_write = (uint)dVar13;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar6 = sptk::SnPrintf<int>(data_to_write,local_238,0x80,local_b8);
        if (!bVar6) {
          return false;
        }
        sVar11 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar11);
        if ((iVar12 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        bVar6 = sptk::WriteStream<int>(data_to_write,(ostream *)&std::cout);
        if (!bVar6) {
          return false;
        }
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }